

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_ident(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos855;
  int yypos855;
  int yythunkpos853;
  int yypos853;
  int yythunkpos851;
  int yypos851;
  int yythunkpos849;
  int yypos849;
  int yythunkpos847;
  int yypos847;
  int yythunkpos845;
  int yypos845;
  int yythunkpos842;
  int yypos842;
  int yythunkpos840;
  int yypos840;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar7 = G->pos;
  iVar3 = G->thunkpos;
  yyText(G,G->begin,G->end);
  G->begin = G->pos;
  iVar6 = G->pos;
  iVar4 = G->thunkpos;
  iVar5 = yymatchString(G,"::");
  if (iVar5 == 0) {
    G->pos = iVar6;
    G->thunkpos = iVar4;
  }
  iVar6 = yymatchClass(G,(uchar *)"","A-Za-z");
  if (iVar6 == 0) {
    G->pos = iVar7;
    G->thunkpos = iVar3;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar7 = yymatchClass(G,(uchar *)"","a-zA-Z");
    if (iVar7 == 0) {
      G->pos = iVar1;
      G->thunkpos = iVar2;
      return 0;
    }
    do {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      iVar7 = yymatchClass(G,(uchar *)"","a-zA-Z0-9");
    } while (iVar7 != 0);
    G->pos = iVar1;
    G->thunkpos = iVar2;
    while( true ) {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      iVar7 = yymatchClass(G,(uchar *)"","-_");
      if ((iVar7 == 0) || (iVar7 = yymatchClass(G,(uchar *)"","a-zA-Z0-9"), iVar7 == 0)) break;
      do {
        iVar1 = G->pos;
        iVar2 = G->thunkpos;
        iVar7 = yymatchClass(G,(uchar *)"","a-zA-Z0-9");
      } while (iVar7 != 0);
      G->pos = iVar1;
      G->thunkpos = iVar2;
    }
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    yyDo(G,yy_2_ident,G->begin,G->end,"yy_2_ident");
  }
  else {
    do {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      iVar7 = yymatchClass(G,(uchar *)"","-A-Za-z0-9_");
    } while (iVar7 != 0);
    G->pos = iVar1;
    G->thunkpos = iVar2;
    while( true ) {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      iVar7 = yymatchString(G,"::");
      if ((iVar7 == 0) || (iVar7 = yymatchClass(G,(uchar *)"","A-Za-z"), iVar7 == 0)) break;
      do {
        iVar1 = G->pos;
        iVar2 = G->thunkpos;
        iVar7 = yymatchClass(G,(uchar *)"","A-Za-z0-9_");
      } while (iVar7 != 0);
      G->pos = iVar1;
      G->thunkpos = iVar2;
    }
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    yyDo(G,yy_1_ident,G->begin,G->end,"yy_1_ident");
  }
  return 1;
}

Assistant:

YY_RULE(int) yy_ident(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "ident"));

  {  int yypos840= G->pos, yythunkpos840= G->thunkpos;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l841;
  {  int yypos842= G->pos, yythunkpos842= G->thunkpos;  if (!yymatchString(G, "::")) goto l842;
  goto l843;
  l842:;	  G->pos= yypos842; G->thunkpos= yythunkpos842;
  }
  l843:;	  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "A-Za-z")) goto l841;

  l844:;	
  {  int yypos845= G->pos, yythunkpos845= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-A-Za-z0-9_")) goto l845;
  goto l844;
  l845:;	  G->pos= yypos845; G->thunkpos= yythunkpos845;
  }
  l846:;	
  {  int yypos847= G->pos, yythunkpos847= G->thunkpos;  if (!yymatchString(G, "::")) goto l847;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "A-Za-z")) goto l847;

  l848:;	
  {  int yypos849= G->pos, yythunkpos849= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "A-Za-z0-9_")) goto l849;
  goto l848;
  l849:;	  G->pos= yypos849; G->thunkpos= yythunkpos849;
  }  goto l846;
  l847:;	  G->pos= yypos847; G->thunkpos= yythunkpos847;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l841;  yyDo(G, yy_1_ident, G->begin, G->end, "yy_1_ident");
  goto l840;
  l841:;	  G->pos= yypos840; G->thunkpos= yythunkpos840;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l839;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z")) goto l839;

  l850:;	
  {  int yypos851= G->pos, yythunkpos851= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9")) goto l851;
  goto l850;
  l851:;	  G->pos= yypos851; G->thunkpos= yythunkpos851;
  }
  l852:;	
  {  int yypos853= G->pos, yythunkpos853= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\000\000\000\000\000\200\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-_")) goto l853;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9")) goto l853;

  l854:;	
  {  int yypos855= G->pos, yythunkpos855= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9")) goto l855;
  goto l854;
  l855:;	  G->pos= yypos855; G->thunkpos= yythunkpos855;
  }  goto l852;
  l853:;	  G->pos= yypos853; G->thunkpos= yythunkpos853;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l839;  yyDo(G, yy_2_ident, G->begin, G->end, "yy_2_ident");

  }
  l840:;	  yyprintf((stderr, "  ok   ident"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l839:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "ident"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}